

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O1

HydroProp * __thiscall OpenMD::Sphere::getHydroProp(Sphere *this,RealType viscosity)

{
  pointer pcVar1;
  double dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  HydroProp *this_00;
  double *__s;
  uint i;
  long lVar9;
  double dVar10;
  Mat6x6d Xi;
  long *local_298 [2];
  long local_288 [2];
  Vector3d local_278;
  Mat6x6d local_258;
  double local_138 [14];
  double local_c8;
  double local_90;
  double local_58;
  double local_20;
  
  dVar10 = viscosity * 18.84955592153876 * this->radius_;
  dVar2 = pow(this->radius_,3.0);
  dVar2 = dVar2 * viscosity * 25.132741228718345;
  __s = local_138;
  lVar9 = 0;
  memset(__s,0,0x120);
  local_138[0] = dVar10;
  local_138[7] = dVar10;
  local_c8 = dVar10;
  local_90 = dVar2;
  local_58 = dVar2;
  local_20 = dVar2;
  do {
    lVar8 = 0;
    do {
      dVar2 = (__s + lVar8)[1];
      __s[lVar8] = __s[lVar8] * 14393.26479;
      (__s + lVar8)[1] = dVar2 * 14393.26479;
      lVar8 = lVar8 + 2;
    } while (lVar8 != 6);
    lVar9 = lVar9 + 1;
    __s = __s + 6;
  } while (lVar9 != 6);
  this_00 = (HydroProp *)operator_new(0x280);
  local_278.super_Vector<double,_3U>.data_[0] = (double)OpenMD::V3Zero._0_8_;
  local_278.super_Vector<double,_3U>.data_[1] = (double)OpenMD::V3Zero._8_8_;
  local_278.super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
  lVar9 = 0;
  do {
    uVar3 = *(undefined8 *)((long)local_138 + lVar9);
    uVar4 = *(undefined8 *)((long)local_138 + lVar9 + 8);
    uVar5 = *(undefined8 *)((long)local_138 + lVar9 + 0x10);
    uVar6 = *(undefined8 *)((long)local_138 + lVar9 + 0x18);
    uVar7 = *(undefined8 *)((long)local_138 + lVar9 + 0x28);
    *(undefined8 *)((long)local_258.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar9 + 0x20) =
         *(undefined8 *)((long)local_138 + lVar9 + 0x20);
    *(undefined8 *)((long)local_258.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar9 + 0x28) =
         uVar7;
    *(undefined8 *)((long)local_258.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar9 + 0x10) =
         uVar5;
    *(undefined8 *)((long)local_258.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar9 + 0x18) =
         uVar6;
    *(undefined8 *)((long)local_258.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar9) = uVar3;
    *(undefined8 *)((long)local_258.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar9 + 8) = uVar4;
    lVar9 = lVar9 + 0x30;
  } while (lVar9 != 0x120);
  HydroProp::HydroProp(this_00,&local_278,&local_258);
  pcVar1 = (this->super_Shape).name_._M_dataplus._M_p;
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_298,pcVar1,pcVar1 + (this->super_Shape).name_._M_string_length);
  std::__cxx11::string::_M_assign((string *)this_00);
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] + 1);
  }
  return this_00;
}

Assistant:

HydroProp* Sphere::getHydroProp(RealType viscosity) {
    RealType Xitt = 6.0 * Constants::PI * viscosity * radius_;
    RealType Xirr = 8.0 * Constants::PI * viscosity * pow(radius_, 3);

    Mat6x6d Xi;

    Xi(0, 0) = Xitt;
    Xi(1, 1) = Xitt;
    Xi(2, 2) = Xitt;
    Xi(3, 3) = Xirr;
    Xi(4, 4) = Xirr;
    Xi(5, 5) = Xirr;

    Xi *= Constants::viscoConvert;

    HydroProp* hprop = new HydroProp(V3Zero, Xi);
    hprop->setName(getName());
    return hprop;
  }